

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O0

aiNodeAnim * CreateNodeAnim(Asset *r,Node *node,AnimationSamplers *samplers)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  aiVectorKey *paVar8;
  float fVar9;
  aiNodeAnim *this;
  Accessor *pAVar10;
  ulong uVar11;
  ulong uVar12;
  aiVectorKey *paVar13;
  aiQuatKey *paVar14;
  aiVector3t<float> *paVar15;
  aiVectorKey *local_1c0;
  aiVectorKey *local_188;
  aiQuatKey *local_160;
  aiQuatKey *local_128;
  aiVectorKey *local_100;
  aiVectorKey *local_c8;
  uint local_9c;
  aiVector3t<float> *paStack_98;
  uint i_2;
  aiVector3D *values_2;
  float *times_2;
  aiQuaterniont<float> *paStack_80;
  uint i_1;
  aiQuaternion *values_1;
  float *times_1;
  aiVector3t<float> *paStack_68;
  uint i;
  aiVector3D *values;
  float *times;
  string local_48;
  aiNodeAnim *local_28;
  aiNodeAnim *anim;
  AnimationSamplers *samplers_local;
  Node *node_local;
  Asset *r_local;
  
  anim = (aiNodeAnim *)samplers;
  samplers_local = (AnimationSamplers *)node;
  node_local = (Node *)r;
  this = (aiNodeAnim *)operator_new(0x438);
  aiNodeAnim::aiNodeAnim(this);
  local_28 = this;
  GetNodeName_abi_cxx11_(&local_48,(Node *)samplers_local);
  aiString::operator=(&local_28->mNodeName,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  lVar1._0_4_ = (anim->mNodeName).length;
  lVar1._4_1_ = (anim->mNodeName).data[0];
  lVar1._5_1_ = (anim->mNodeName).data[1];
  lVar1._6_1_ = (anim->mNodeName).data[2];
  lVar1._7_1_ = (anim->mNodeName).data[3];
  if (lVar1 == 0) {
    if (((ulong)samplers_local[6].scale & 1) != 0) {
      local_28->mNumPositionKeys = 1;
      uVar11 = CONCAT44(0,local_28->mNumPositionKeys);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar11;
      uVar12 = SUB168(auVar3 * ZEXT816(0x18),0);
      if (SUB168(auVar3 * ZEXT816(0x18),8) != 0) {
        uVar12 = 0xffffffffffffffff;
      }
      paVar13 = (aiVectorKey *)operator_new__(uVar12);
      if (uVar11 != 0) {
        local_100 = paVar13;
        do {
          aiVectorKey::aiVectorKey(local_100);
          local_100 = local_100 + 1;
        } while (local_100 != paVar13 + uVar11);
      }
      local_28->mPositionKeys = paVar13;
      local_28->mPositionKeys->mTime = 0.0;
      (local_28->mPositionKeys->mValue).x = *(float *)((long)&samplers_local[6].translation + 4);
      (local_28->mPositionKeys->mValue).y = *(float *)&samplers_local[6].rotation;
      (local_28->mPositionKeys->mValue).z = *(float *)((long)&samplers_local[6].rotation + 4);
    }
  }
  else {
    values = (aiVector3D *)0x0;
    pAVar10 = glTF2::Ref<glTF2::Accessor>::operator->(*(Ref<glTF2::Accessor> **)&anim->mNodeName);
    glTF2::Accessor::ExtractData<float>(pAVar10,(float **)&values);
    paStack_68 = (aiVector3t<float> *)0x0;
    pAVar10 = glTF2::Ref<glTF2::Accessor>::operator->
                        ((Ref<glTF2::Accessor> *)(*(long *)&anim->mNodeName + 0x10));
    glTF2::Accessor::ExtractData<aiVector3t<float>>(pAVar10,&stack0xffffffffffffff98);
    pAVar10 = glTF2::Ref<glTF2::Accessor>::operator->(*(Ref<glTF2::Accessor> **)&anim->mNodeName);
    local_28->mNumPositionKeys = (uint)pAVar10->count;
    uVar11 = CONCAT44(0,local_28->mNumPositionKeys);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar11;
    uVar12 = SUB168(auVar2 * ZEXT816(0x18),0);
    if (SUB168(auVar2 * ZEXT816(0x18),8) != 0) {
      uVar12 = 0xffffffffffffffff;
    }
    paVar13 = (aiVectorKey *)operator_new__(uVar12);
    if (uVar11 != 0) {
      local_c8 = paVar13;
      do {
        aiVectorKey::aiVectorKey(local_c8);
        local_c8 = local_c8 + 1;
      } while (local_c8 != paVar13 + uVar11);
    }
    local_28->mPositionKeys = paVar13;
    for (times_1._4_4_ = 0; times_1._4_4_ < local_28->mNumPositionKeys;
        times_1._4_4_ = times_1._4_4_ + 1) {
      local_28->mPositionKeys[times_1._4_4_].mTime = (double)((&values->x)[times_1._4_4_] * 1000.0);
      paVar15 = paStack_68 + times_1._4_4_;
      paVar13 = local_28->mPositionKeys;
      fVar9 = paVar15->y;
      paVar8 = paVar13 + times_1._4_4_;
      (paVar8->mValue).x = paVar15->x;
      (paVar8->mValue).y = fVar9;
      paVar13[times_1._4_4_].mValue.z = paVar15->z;
    }
    if (values != (aiVector3D *)0x0) {
      operator_delete__(values);
    }
    if (paStack_68 != (aiVector3t<float> *)0x0) {
      operator_delete__(paStack_68);
    }
  }
  if (*(long *)((anim->mNodeName).data + 4) == 0) {
    if (((ulong)samplers_local[7].translation & 0x100000000) != 0) {
      local_28->mNumRotationKeys = 1;
      uVar11 = CONCAT44(0,local_28->mNumRotationKeys);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar11;
      uVar12 = SUB168(auVar5 * ZEXT816(0x18),0);
      if (SUB168(auVar5 * ZEXT816(0x18),8) != 0) {
        uVar12 = 0xffffffffffffffff;
      }
      paVar14 = (aiQuatKey *)operator_new__(uVar12);
      if (uVar11 != 0) {
        local_160 = paVar14;
        do {
          aiQuatKey::aiQuatKey(local_160);
          local_160 = local_160 + 1;
        } while (local_160 != paVar14 + uVar11);
      }
      local_28->mRotationKeys = paVar14;
      local_28->mRotationKeys->mTime = 0.0;
      (local_28->mRotationKeys->mValue).x = *(float *)((long)&samplers_local[6].scale + 4);
      (local_28->mRotationKeys->mValue).y = *(float *)&samplers_local[6].weight;
      (local_28->mRotationKeys->mValue).z = *(float *)((long)&samplers_local[6].weight + 4);
      (local_28->mRotationKeys->mValue).w = *(float *)&samplers_local[7].translation;
    }
  }
  else {
    values_1 = (aiQuaternion *)0x0;
    pAVar10 = glTF2::Ref<glTF2::Accessor>::operator->
                        (*(Ref<glTF2::Accessor> **)((anim->mNodeName).data + 4));
    glTF2::Accessor::ExtractData<float>(pAVar10,(float **)&values_1);
    paStack_80 = (aiQuaterniont<float> *)0x0;
    pAVar10 = glTF2::Ref<glTF2::Accessor>::operator->
                        ((Ref<glTF2::Accessor> *)(*(long *)((anim->mNodeName).data + 4) + 0x10));
    glTF2::Accessor::ExtractData<aiQuaterniont<float>>(pAVar10,&stack0xffffffffffffff80);
    pAVar10 = glTF2::Ref<glTF2::Accessor>::operator->
                        (*(Ref<glTF2::Accessor> **)((anim->mNodeName).data + 4));
    local_28->mNumRotationKeys = (uint)pAVar10->count;
    uVar11 = CONCAT44(0,local_28->mNumRotationKeys);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar11;
    uVar12 = SUB168(auVar4 * ZEXT816(0x18),0);
    if (SUB168(auVar4 * ZEXT816(0x18),8) != 0) {
      uVar12 = 0xffffffffffffffff;
    }
    paVar14 = (aiQuatKey *)operator_new__(uVar12);
    if (uVar11 != 0) {
      local_128 = paVar14;
      do {
        aiQuatKey::aiQuatKey(local_128);
        local_128 = local_128 + 1;
      } while (local_128 != paVar14 + uVar11);
    }
    local_28->mRotationKeys = paVar14;
    for (times_2._4_4_ = 0; times_2._4_4_ < local_28->mNumRotationKeys;
        times_2._4_4_ = times_2._4_4_ + 1) {
      local_28->mRotationKeys[times_2._4_4_].mTime =
           (double)((&values_1->w)[times_2._4_4_] * 1000.0);
      local_28->mRotationKeys[times_2._4_4_].mValue.x = paStack_80[times_2._4_4_].w;
      local_28->mRotationKeys[times_2._4_4_].mValue.y = paStack_80[times_2._4_4_].x;
      local_28->mRotationKeys[times_2._4_4_].mValue.z = paStack_80[times_2._4_4_].y;
      local_28->mRotationKeys[times_2._4_4_].mValue.w = paStack_80[times_2._4_4_].z;
    }
    if (values_1 != (aiQuaternion *)0x0) {
      operator_delete__(values_1);
    }
    if (paStack_80 != (aiQuaterniont<float> *)0x0) {
      operator_delete__(paStack_80);
    }
  }
  if (*(long *)((anim->mNodeName).data + 0xc) == 0) {
    if (((ulong)samplers_local[7].scale & 0x100000000) != 0) {
      local_28->mNumScalingKeys = 1;
      uVar11 = CONCAT44(0,local_28->mNumScalingKeys);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar11;
      uVar12 = SUB168(auVar7 * ZEXT816(0x18),0);
      if (SUB168(auVar7 * ZEXT816(0x18),8) != 0) {
        uVar12 = 0xffffffffffffffff;
      }
      paVar13 = (aiVectorKey *)operator_new__(uVar12);
      if (uVar11 != 0) {
        local_1c0 = paVar13;
        do {
          aiVectorKey::aiVectorKey(local_1c0);
          local_1c0 = local_1c0 + 1;
        } while (local_1c0 != paVar13 + uVar11);
      }
      local_28->mScalingKeys = paVar13;
      local_28->mScalingKeys->mTime = 0.0;
      (local_28->mScalingKeys->mValue).x = *(float *)&samplers_local[7].rotation;
      (local_28->mScalingKeys->mValue).y = *(float *)((long)&samplers_local[7].rotation + 4);
      (local_28->mScalingKeys->mValue).z = *(float *)&samplers_local[7].scale;
    }
  }
  else {
    values_2 = (aiVector3D *)0x0;
    pAVar10 = glTF2::Ref<glTF2::Accessor>::operator->
                        (*(Ref<glTF2::Accessor> **)((anim->mNodeName).data + 0xc));
    glTF2::Accessor::ExtractData<float>(pAVar10,(float **)&values_2);
    paStack_98 = (aiVector3t<float> *)0x0;
    pAVar10 = glTF2::Ref<glTF2::Accessor>::operator->
                        ((Ref<glTF2::Accessor> *)(*(long *)((anim->mNodeName).data + 0xc) + 0x10));
    glTF2::Accessor::ExtractData<aiVector3t<float>>(pAVar10,&stack0xffffffffffffff68);
    pAVar10 = glTF2::Ref<glTF2::Accessor>::operator->
                        (*(Ref<glTF2::Accessor> **)((anim->mNodeName).data + 0xc));
    local_28->mNumScalingKeys = (uint)pAVar10->count;
    uVar11 = CONCAT44(0,local_28->mNumScalingKeys);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar11;
    uVar12 = SUB168(auVar6 * ZEXT816(0x18),0);
    if (SUB168(auVar6 * ZEXT816(0x18),8) != 0) {
      uVar12 = 0xffffffffffffffff;
    }
    paVar13 = (aiVectorKey *)operator_new__(uVar12);
    if (uVar11 != 0) {
      local_188 = paVar13;
      do {
        aiVectorKey::aiVectorKey(local_188);
        local_188 = local_188 + 1;
      } while (local_188 != paVar13 + uVar11);
    }
    local_28->mScalingKeys = paVar13;
    for (local_9c = 0; local_9c < local_28->mNumScalingKeys; local_9c = local_9c + 1) {
      local_28->mScalingKeys[local_9c].mTime = (double)((&values_2->x)[local_9c] * 1000.0);
      paVar15 = paStack_98 + local_9c;
      paVar13 = local_28->mScalingKeys;
      fVar9 = paVar15->y;
      paVar8 = paVar13 + local_9c;
      (paVar8->mValue).x = paVar15->x;
      (paVar8->mValue).y = fVar9;
      paVar13[local_9c].mValue.z = paVar15->z;
    }
    if (values_2 != (aiVector3D *)0x0) {
      operator_delete__(values_2);
    }
    if (paStack_98 != (aiVector3t<float> *)0x0) {
      operator_delete__(paStack_98);
    }
  }
  return local_28;
}

Assistant:

aiNodeAnim* CreateNodeAnim(glTF2::Asset& r, Node& node, AnimationSamplers& samplers)
{
    aiNodeAnim* anim = new aiNodeAnim();
    anim->mNodeName = GetNodeName(node);

    static const float kMillisecondsFromSeconds = 1000.f;

    if (samplers.translation) {
        float* times = nullptr;
        samplers.translation->input->ExtractData(times);
        aiVector3D* values = nullptr;
        samplers.translation->output->ExtractData(values);
        anim->mNumPositionKeys = static_cast<uint32_t>(samplers.translation->input->count);
        anim->mPositionKeys = new aiVectorKey[anim->mNumPositionKeys];
        for (unsigned int i = 0; i < anim->mNumPositionKeys; ++i) {
            anim->mPositionKeys[i].mTime = times[i] * kMillisecondsFromSeconds;
            anim->mPositionKeys[i].mValue = values[i];
        }
        delete[] times;
        delete[] values;
    } else if (node.translation.isPresent) {
        anim->mNumPositionKeys = 1;
        anim->mPositionKeys = new aiVectorKey[anim->mNumPositionKeys];
        anim->mPositionKeys->mTime = 0.f;
        anim->mPositionKeys->mValue.x = node.translation.value[0];
        anim->mPositionKeys->mValue.y = node.translation.value[1];
        anim->mPositionKeys->mValue.z = node.translation.value[2];
    }

    if (samplers.rotation) {
        float* times = nullptr;
        samplers.rotation->input->ExtractData(times);
        aiQuaternion* values = nullptr;
        samplers.rotation->output->ExtractData(values);
        anim->mNumRotationKeys = static_cast<uint32_t>(samplers.rotation->input->count);
        anim->mRotationKeys = new aiQuatKey[anim->mNumRotationKeys];
        for (unsigned int i = 0; i < anim->mNumRotationKeys; ++i) {
            anim->mRotationKeys[i].mTime = times[i] * kMillisecondsFromSeconds;
            anim->mRotationKeys[i].mValue.x = values[i].w;
            anim->mRotationKeys[i].mValue.y = values[i].x;
            anim->mRotationKeys[i].mValue.z = values[i].y;
            anim->mRotationKeys[i].mValue.w = values[i].z;
        }
        delete[] times;
        delete[] values;
    } else if (node.rotation.isPresent) {
        anim->mNumRotationKeys = 1;
        anim->mRotationKeys = new aiQuatKey[anim->mNumRotationKeys];
        anim->mRotationKeys->mTime = 0.f;
        anim->mRotationKeys->mValue.x = node.rotation.value[0];
        anim->mRotationKeys->mValue.y = node.rotation.value[1];
        anim->mRotationKeys->mValue.z = node.rotation.value[2];
        anim->mRotationKeys->mValue.w = node.rotation.value[3];
    }

    if (samplers.scale) {
        float* times = nullptr;
        samplers.scale->input->ExtractData(times);
        aiVector3D* values = nullptr;
        samplers.scale->output->ExtractData(values);
        anim->mNumScalingKeys = static_cast<uint32_t>(samplers.scale->input->count);
        anim->mScalingKeys = new aiVectorKey[anim->mNumScalingKeys];
        for (unsigned int i = 0; i < anim->mNumScalingKeys; ++i) {
            anim->mScalingKeys[i].mTime = times[i] * kMillisecondsFromSeconds;
            anim->mScalingKeys[i].mValue = values[i];
        }
        delete[] times;
        delete[] values;
    } else if (node.scale.isPresent) {
        anim->mNumScalingKeys = 1;
        anim->mScalingKeys = new aiVectorKey[anim->mNumScalingKeys];
        anim->mScalingKeys->mTime = 0.f;
        anim->mScalingKeys->mValue.x = node.scale.value[0];
        anim->mScalingKeys->mValue.y = node.scale.value[1];
        anim->mScalingKeys->mValue.z = node.scale.value[2];
    }

    return anim;
}